

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

duckdb_logical_type duckdb_array_type_child_type(duckdb_logical_type type)

{
  LogicalType *this;
  LogicalType *other;
  
  if ((type == (duckdb_logical_type)0x0) || (*type != (_duckdb_logical_type)0x6c)) {
    this = (LogicalType *)0x0;
  }
  else {
    this = (LogicalType *)operator_new(0x18);
    other = duckdb::ArrayType::GetChildType((LogicalType *)type);
    duckdb::LogicalType::LogicalType(this,other);
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_array_type_child_type(duckdb_logical_type type) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::ARRAY)) {
		return nullptr;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != duckdb::LogicalTypeId::ARRAY) {
		return nullptr;
	}
	return reinterpret_cast<duckdb_logical_type>(
	    new duckdb::LogicalType(duckdb::ArrayType::GetChildType(logical_type)));
}